

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

int __thiscall
Js::FunctionBody::GetEnclosingStatementIndexFromByteCode
          (FunctionBody *this,int byteCodeOffset,bool ignoreSubexpressions)

{
  byte bVar1;
  StatementMap *pSVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  undefined4 *puVar6;
  Type *pTVar7;
  int index;
  
  this_00 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)4,void*>
                         ((FunctionProxy *)this);
  if (this_00 ==
      (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    iVar5 = -1;
  }
  else {
    if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xc1c,"(m_sourceInfo.pSpanSequence == nullptr)",
                                  "m_sourceInfo.pSpanSequence == nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    for (index = 0;
        iVar5 = (this_00->
                super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                ).count, index < iVar5; index = index + 1) {
      pTVar7 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_00,index);
      pSVar2 = pTVar7->ptr;
      if ((!ignoreSubexpressions) || (bVar1 = pSVar2->isSubexpression, (Type)bVar1 == false)) {
        bVar4 = regex::Interval::Includes(&pSVar2->byteCodeSpan,byteCodeOffset);
        if (bVar4) {
          return index;
        }
        bVar1 = pSVar2->isSubexpression;
      }
      if (((bVar1 & 1) == 0) && (byteCodeOffset < (pSVar2->byteCodeSpan).begin)) {
        if (index != 0) {
          return index + -1;
        }
        return 0;
      }
    }
    iVar5 = iVar5 + -1;
  }
  return iVar5;
}

Assistant:

int FunctionBody::GetEnclosingStatementIndexFromByteCode(int byteCodeOffset, bool ignoreSubexpressions /* = false */)
    {
        StatementMapList * pStatementMaps = this->GetStatementMaps();
        if (pStatementMaps == nullptr)
        {
            // e.g. internal library.
            return -1;
        }

        Assert(m_sourceInfo.pSpanSequence == nullptr);

        for (int index = 0; index < pStatementMaps->Count(); index++)
        {
            FunctionBody::StatementMap* pStatementMap = pStatementMaps->Item(index);

            if (!(ignoreSubexpressions && pStatementMap->isSubexpression) && pStatementMap->byteCodeSpan.Includes(byteCodeOffset))
            {
                return index;
            }
            else if (!pStatementMap->isSubexpression && byteCodeOffset < pStatementMap->byteCodeSpan.begin) // We always ignore sub expressions when checking if we went too far
            {
                return index > 0 ? index - 1 : 0;
            }
        }

        return pStatementMaps->Count() - 1;
    }